

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdDmaVtx::emulate_mthd(MthdDmaVtx *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  undefined2 uVar4;
  uint uVar5;
  
  uVar4 = (undefined2)(this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.pobj[0];
  uVar5 = uVar3 & 0xfff;
  if (uVar5 != 2) {
    if (uVar5 == 0x30) goto LAB_00206a73;
    if (uVar5 != 0x3d) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000) != 0)
      {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
      }
      if (uVar5 == 0x30) goto LAB_00206a73;
      uVar3 = (this->super_SingleMthdTest).super_MthdTest.pobj[0];
    }
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[1];
  if ((uVar3 & 0x3000) == 0) {
    pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.intr +
                     1);
    *pbVar1 = *pbVar1 | 4;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fifo_enable = 0;
  }
  if ((uVar3 & 0xff00000) != 0 || (~uVar2 & 0xff) != 0) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4);
  }
LAB_00206a73:
  if (uVar5 == 0x30) {
    uVar4 = 0;
  }
  *(undefined2 *)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma =
       uVar4;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xffff;
		int dcls = extr(pobj[0], 0, 12);
		if (dcls == 0x30)
			rval = 0;
		bool bad = false;
		if (dcls != 0x30 && dcls != 0x3d && dcls != 2)
			bad = true;
		if (bad && extr(exp.debug_d, 23, 1))
			nv04_pgraph_blowup(&exp, 2);
		bool prot_err = false;
		if (dcls != 0x30) {
			if (extr(pobj[1], 0, 8) != 0xff)
				prot_err = true;
			if (extr(pobj[0], 20, 8))
				prot_err = true;
			if (!extr(pobj[0], 12, 2)) {
				exp.intr |= 0x400;
				exp.fifo_enable = 0;
			}
		}
#if 0
		// XXX: figure this out
		if (dcls == 0x30 && nv04_pgraph_is_nv15p(&chipset)) {
			exp.intr |= 0x400;
			exp.fifo_enable = 0;
		}
#endif
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.celsius_dma, 0, 16, rval);
	}